

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightbuffer.cpp
# Opt level: O0

int __thiscall FLightBuffer::UploadLights(FLightBuffer *this,FDynLightData *data)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  uint bufferindex;
  float parmcnt [4];
  float *copyptr;
  uint newbuffer;
  int diff;
  int totalsize;
  int size2;
  int size1;
  int size0;
  FDynLightData *data_local;
  FLightBuffer *this_local;
  
  _size1 = data->arrays;
  data_local = (FDynLightData *)this;
  uVar1 = TArray<float,_float>::Size(data->arrays);
  size2 = uVar1 >> 2;
  uVar1 = TArray<float,_float>::Size(_size1 + 1);
  totalsize = uVar1 >> 2;
  uVar1 = TArray<float,_float>::Size(_size1 + 2);
  diff = uVar1 >> 2;
  newbuffer = size2 + totalsize + diff + 1;
  if (((this->mBlockAlign != 0) && (this->mBlockSize < newbuffer + this->mIndex % this->mBlockAlign)
      ) && (this->mIndex = ((this->mIndex + this->mBlockAlign) / this->mBlockAlign) *
                           this->mBlockAlign, this->mBlockSize < newbuffer)) {
    copyptr._4_4_ = newbuffer - this->mBlockSize;
    diff = diff - copyptr._4_4_;
    if (diff < 0) {
      totalsize = diff + totalsize;
      diff = 0;
    }
    if (totalsize < 0) {
      size2 = totalsize + size2;
      totalsize = 0;
    }
    newbuffer = size2 + totalsize + diff + 1;
  }
  if ((int)newbuffer < 2) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    if (this->mBufferSize >> 2 < this->mIndex + newbuffer) {
      (*_ptrc_glBindBuffer)(this->mBufferType,this->mBufferId);
      (*_ptrc_glUnmapBuffer)(this->mBufferType);
      (*_ptrc_glGenBuffers)(1,(GLuint *)&copyptr);
      (*_ptrc_glBindBufferBase)(this->mBufferType,1,(GLuint)copyptr);
      (*_ptrc_glBindBuffer)(this->mBufferType,(GLuint)copyptr);
      (*_ptrc_glBindBuffer)(0x8f36,this->mBufferId);
      this->mBufferSize = this->mBufferSize << 1;
      this->mByteSize = this->mByteSize << 1;
      if (gl.lightmethod == 2) {
        (*_ptrc_glBufferStorage)(this->mBufferType,(GLsizeiptr)this->mByteSize,(void *)0x0,0xc2);
        pfVar2 = (float *)(*_ptrc_glMapBufferRange)
                                    (this->mBufferType,0,(GLsizeiptr)this->mByteSize,0xc2);
        this->mBufferPointer = pfVar2;
      }
      else {
        (*_ptrc_glBufferData)(this->mBufferType,(GLsizeiptr)this->mByteSize,(void *)0x0,0x88e8);
        pfVar2 = (float *)(*_ptrc_glMapBufferRange)
                                    (this->mBufferType,0,(GLsizeiptr)this->mByteSize,10);
        this->mBufferPointer = pfVar2;
      }
      (*_ptrc_glCopyBufferSubData)(0x8f36,this->mBufferType,0,0,0);
      (*_ptrc_glBindBuffer)(0x8f36,0);
      (*_ptrc_glDeleteBuffers)(1,&this->mBufferId);
      this->mBufferId = (GLuint)copyptr;
    }
    if (this->mBufferPointer == (float *)0x0) {
      __assert_fail("mBufferPointer != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/dynlights/gl_lightbuffer.cpp"
                    ,0xae,"int FLightBuffer::UploadLights(FDynLightData &)");
    }
    if (this->mBufferPointer == (float *)0x0) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      pfVar2 = this->mBufferPointer + (this->mIndex << 2);
      *(ulong *)pfVar2 = (ulong)(uint)(float)size2 << 0x20;
      *(long *)(pfVar2 + 2) = CONCAT44((float)(size2 + totalsize + diff),(float)(size2 + totalsize))
      ;
      pfVar3 = TArray<float,_float>::operator[](_size1,0);
      memcpy(pfVar2 + 4,pfVar3,(long)(size2 << 2) << 2);
      iVar4 = size2 * 4;
      pfVar3 = TArray<float,_float>::operator[](_size1 + 1,0);
      memcpy(pfVar2 + (iVar4 + 4),pfVar3,(long)(totalsize << 2) << 2);
      iVar4 = size2 + totalsize;
      pfVar3 = TArray<float,_float>::operator[](_size1 + 2,0);
      memcpy(pfVar2 + (iVar4 * 4 + 4),pfVar3,(long)(diff << 2) << 2);
      this_local._4_4_ = this->mIndex;
      this->mIndex = newbuffer + this->mIndex;
      draw_dlight = (int)(newbuffer - 1) / 2 + draw_dlight;
    }
  }
  return this_local._4_4_;
}

Assistant:

int FLightBuffer::UploadLights(FDynLightData &data)
{
	int size0 = data.arrays[0].Size()/4;
	int size1 = data.arrays[1].Size()/4;
	int size2 = data.arrays[2].Size()/4;
	int totalsize = size0 + size1 + size2 + 1;

	// pointless type casting because some compilers can't print enough warnings.
	if (mBlockAlign > 0 && (unsigned int)totalsize + (mIndex % mBlockAlign) > mBlockSize)
	{
		mIndex = ((mIndex + mBlockAlign) / mBlockAlign) * mBlockAlign;

		// can't be rendered all at once.
		if ((unsigned int)totalsize > mBlockSize)
		{
			int diff = totalsize - (int)mBlockSize;

			size2 -= diff;
			if (size2 < 0)
			{
				size1 += size2;
				size2 = 0;
			}
			if (size1 < 0)
			{
				size0 += size1;
				size1 = 0;
			}
			totalsize = size0 + size1 + size2 + 1;
		}
	}

	if (totalsize <= 1) return -1;

	if (mIndex + totalsize > mBufferSize/4)
	{
		// reallocate the buffer with twice the size
		unsigned int newbuffer;

		// first unmap the old buffer
		glBindBuffer(mBufferType, mBufferId);
		glUnmapBuffer(mBufferType);

		// create and bind the new buffer, bind the old one to a copy target (too bad that DSA is not yet supported well enough to omit this crap.)
		glGenBuffers(1, &newbuffer);
		glBindBufferBase(mBufferType, LIGHTBUF_BINDINGPOINT, newbuffer);
		glBindBuffer(mBufferType, newbuffer);	// Note: Some older AMD drivers don't do that in glBindBufferBase, as they should.
		glBindBuffer(GL_COPY_READ_BUFFER, mBufferId);

		// create the new buffer's storage (twice as large as the old one)
		mBufferSize *= 2;
		mByteSize *= 2;
		if (gl.lightmethod == LM_DIRECT)
		{
			glBufferStorage(mBufferType, mByteSize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
			mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		}
		else
		{
			glBufferData(mBufferType, mByteSize, NULL, GL_DYNAMIC_DRAW);
			mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT|GL_MAP_INVALIDATE_BUFFER_BIT);
		}

		// copy contents and delete the old buffer.
		glCopyBufferSubData(GL_COPY_READ_BUFFER, mBufferType, 0, 0, mByteSize/2);
		glBindBuffer(GL_COPY_READ_BUFFER, 0);
		glDeleteBuffers(1, &mBufferId);
		mBufferId = newbuffer;
	}

	float *copyptr;
	
	assert(mBufferPointer != NULL);
	if (mBufferPointer == NULL) return -1;
	copyptr = mBufferPointer + mIndex * 4;

	float parmcnt[] = { 0, float(size0), float(size0 + size1), float(size0 + size1 + size2) };

	memcpy(&copyptr[0], parmcnt, 4 * sizeof(float));
	memcpy(&copyptr[4], &data.arrays[0][0], 4 * size0*sizeof(float));
	memcpy(&copyptr[4 + 4*size0], &data.arrays[1][0], 4 * size1*sizeof(float));
	memcpy(&copyptr[4 + 4*(size0 + size1)], &data.arrays[2][0], 4 * size2*sizeof(float));

	unsigned int bufferindex = mIndex;
	mIndex += totalsize;
	draw_dlight += (totalsize-1) / 2;
	return bufferindex;
}